

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsStaticSizedAccessImmutable(void)

{
  Span<const_int,_4UL> *pSVar1;
  ostream *poVar2;
  bool bVar3;
  initializer_list<int> __l;
  allocator_type local_39;
  Span<const_int,_4UL> local_38;
  vector<int,_std::allocator<int>_> values;
  Span<int_const,18446744073709551615ul> *this;
  
  this = (Span<int_const,18446744073709551615ul> *)&local_38;
  local_38.m_ptr = (pointer)0x200000001;
  local_38._8_8_ = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)this;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_39);
  local_38.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_38.m_ptr =
         values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_38._8_8_ =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  pSVar1 = MILBlob::Util::Span<int_const,18446744073709551615ul>::StaticResize<4ul>(&local_38,this);
  bVar3 = *(int *)&pSVar1->m_ptr != 1;
  if (bVar3) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x111);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(span.Get<0>()) == (1)");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return (uint)bVar3;
}

Assistant:

int testSpanTestsStaticSizedAccessImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values).StaticResize<4>();

    ML_ASSERT_EQ(span.Get<0>(), 1);

    static_assert(std::is_same<decltype(span.Get<0>()), const int&>::value, "Get<0>() should be immutable");

    return 0;
}